

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O3

char * jsonnet_evaluate_snippet_aux
                 (JsonnetVm *vm,char *filename,char *snippet,int *error,EvalKind kind)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
  *ext_vars;
  VmNativeCallbackMap *natives;
  _Base_ptr *pp_Var1;
  _Base_ptr p_Var2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *doc;
  _Base_ptr p_Var4;
  char *pcVar5;
  undefined8 extraout_RAX;
  StaticError *err;
  long *plVar6;
  ostream *poVar7;
  int extraout_EDX;
  ulong uVar8;
  ulong uVar9;
  JsonnetVm *pJVar10;
  size_t sVar11;
  iterator __begin3_1;
  undefined8 *puVar12;
  ulong uVar13;
  _Rb_tree_header *p_Var14;
  uint uVar15;
  iterator __begin3;
  long lVar16;
  allocator<char> local_221;
  AST *expr;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  files;
  Tokens tokens;
  Allocator alloc;
  ios_base local_138 [264];
  
  alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header;
  alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  alloc.allocated.
  super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&alloc.allocated;
  alloc.allocated.
  super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl.
  _M_node._M_size = 0;
  alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  alloc.allocated.
  super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       alloc.allocated.
       super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl
       ._M_node.super__List_node_base._M_next;
  std::__cxx11::string::string<std::allocator<char>>((string *)&files,filename,&local_221);
  jsonnet::internal::jsonnet_lex(&tokens,(string *)&files,snippet);
  pp_Var1 = &files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((_Base_ptr *)files._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)files._M_t._M_impl._0_8_,
                    (ulong)((long)&(files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  expr = jsonnet::internal::jsonnet_parse(&alloc,&tokens);
  jsonnet::internal::jsonnet_desugar(&alloc,&expr,&vm->tla);
  uVar15 = vm->maxStack;
  jsonnet::internal::jsonnet_static_analysis(expr);
  uVar15 = uVar15 + 2;
  ext_vars = &vm->ext;
  natives = &vm->nativeCallbacks;
  if (kind == REGULAR) {
    jsonnet::internal::jsonnet_vm_execute
              ((string *)&files,&alloc,expr,ext_vars,uVar15,(double)vm->gcMinObjects,
               vm->gcGrowthTrigger,natives,vm->importCallback,vm->importCallbackContext,
               vm->stringOutput);
    pJVar10 = (JsonnetVm *)&files;
    std::__cxx11::string::append((char *)pJVar10);
    *error = 0;
    pcVar5 = jsonnet_realloc(pJVar10,(char *)0x0,
                             files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
    memcpy(pcVar5,(void *)files._M_t._M_impl._0_8_,
           files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
    if ((_Base_ptr *)files._M_t._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)files._M_t._M_impl._0_8_,
                      (ulong)((long)&(files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                     ->_M_color + 1));
    }
    goto LAB_001483c1;
  }
  if (kind != MULTI) {
    jsonnet::internal::jsonnet_vm_execute_stream
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&files,&alloc,expr,ext_vars,uVar15,(double)vm->gcMinObjects,vm->gcGrowthTrigger,
               natives,vm->importCallback,vm->importCallbackContext,vm->stringOutput);
    p_Var14 = (_Rb_tree_header *)files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
    puVar12 = (undefined8 *)files._M_t._M_impl._0_8_;
    if (files._M_t._M_impl._0_8_ == files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_) {
      pcVar5 = (char *)malloc(1);
      if (pcVar5 == (char *)0x0) goto LAB_001483ef;
LAB_001483aa:
      lVar16 = 0;
    }
    else {
      sVar11 = 1;
      lVar16 = files._M_t._M_impl._0_8_;
      do {
        sVar11 = sVar11 + *(long *)(lVar16 + 8) + 2;
        lVar16 = lVar16 + 0x20;
      } while (lVar16 != files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
      pcVar5 = (char *)malloc(sVar11);
      if (pcVar5 == (char *)0x0) goto LAB_001483ef;
      if ((_Rb_tree_header *)puVar12 == p_Var14) goto LAB_001483aa;
      lVar16 = 0;
      do {
        sVar11 = puVar12[1];
        memcpy(pcVar5 + lVar16,(void *)*puVar12,sVar11);
        (pcVar5 + sVar11 + lVar16)[0] = '\n';
        (pcVar5 + sVar11 + lVar16)[1] = '\0';
        lVar16 = lVar16 + sVar11 + 2;
        puVar12 = puVar12 + 4;
      } while ((_Rb_tree_header *)puVar12 != p_Var14);
    }
    pcVar5[lVar16] = '\0';
    *error = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&files);
    goto LAB_001483c1;
  }
  jsonnet::internal::jsonnet_vm_execute_multi
            (&files,&alloc,expr,ext_vars,uVar15,(double)vm->gcMinObjects,vm->gcGrowthTrigger,natives
             ,vm->importCallback,vm->importCallbackContext,vm->stringOutput);
  p_Var14 = &files._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)files._M_t._M_impl.super__Rb_tree_header._M_header._M_left == p_Var14) {
    pcVar5 = (char *)malloc(1);
    if (pcVar5 == (char *)0x0) goto LAB_001483ea;
LAB_0014837e:
    lVar16 = 0;
  }
  else {
    vm = (JsonnetVm *)0x1;
    p_Var4 = files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      vm = (JsonnetVm *)
           ((long)&(p_Var4[2]._M_parent)->_M_color +
           (long)&(p_Var4[1]._M_parent)->_M_color + (long)&vm->gcGrowthTrigger + 3);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var14);
    pcVar5 = (char *)malloc((size_t)vm);
    if (pcVar5 == (char *)0x0) {
LAB_001483ea:
      jsonnet_evaluate_snippet_aux();
LAB_001483ef:
      jsonnet_evaluate_snippet_aux();
      if ((_Rb_tree_header *)files._M_t._M_impl._0_8_ != p_Var14) {
        operator_delete((void *)files._M_t._M_impl._0_8_,
                        (ulong)((long)&(files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                                       )->_M_color + 1));
      }
      std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
      ::_M_clear(&tokens.
                  super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                );
      jsonnet::internal::Allocator::~Allocator(&alloc);
      if (extraout_EDX == 2) {
        err = (StaticError *)__cxa_begin_catch(extraout_RAX);
        std::__cxx11::stringstream::stringstream((stringstream *)&alloc);
        poVar7 = (ostream *)
                 &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"STATIC ERROR: ",0xe);
        jsonnet::internal::operator<<(poVar7,err);
        std::endl<char,std::char_traits<char>>(poVar7);
        *error = 1;
        pJVar10 = (JsonnetVm *)&files;
        std::__cxx11::stringbuf::str();
        pcVar5 = jsonnet_realloc(pJVar10,(char *)0x0,
                                 files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
        memcpy(pcVar5,(void *)files._M_t._M_impl._0_8_,
               files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
        if ((_Base_ptr *)files._M_t._M_impl._0_8_ !=
            &files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)files._M_t._M_impl._0_8_,
                          (ulong)((long)&(files._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
      }
      else {
        if (extraout_EDX != 1) {
          _Unwind_Resume(extraout_RAX);
        }
        plVar6 = (long *)__cxa_begin_catch(extraout_RAX);
        std::__cxx11::stringstream::stringstream((stringstream *)&alloc);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                   ,"RUNTIME ERROR: ",0xf);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)
                            &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header.
                             _M_parent,(char *)plVar6[3],plVar6[4]);
        std::endl<char,std::char_traits<char>>(poVar7);
        if (0 < plVar6[1] - *plVar6) {
          uVar15 = vm->maxTrace;
          uVar9 = (ulong)(uVar15 >> 1);
          uVar8 = (ulong)(plVar6[1] - *plVar6) / 0x60;
          lVar16 = 0;
          uVar13 = 0;
          do {
            lVar3 = *plVar6;
            if (((vm->maxTrace == 0) || (uVar13 < uVar9)) ||
               ((long)((uVar9 - uVar15) + uVar8) <= (long)uVar13)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent,"\t",1);
              jsonnet::internal::operator<<
                        ((ostream *)
                         &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent,(LocationRange *)(lVar16 + lVar3));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent,"\t",1);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)
                                  &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header.
                                   _M_header._M_parent,*(char **)(lVar3 + 0x40 + lVar16),
                                  *(long *)(lVar3 + 0x48 + lVar16));
LAB_00148656:
              std::endl<char,std::char_traits<char>>(poVar7);
            }
            else if (uVar9 == uVar13) {
              poVar7 = (ostream *)
                       &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_parent;
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t...",4);
              goto LAB_00148656;
            }
            uVar13 = uVar13 + 1;
            lVar16 = lVar16 + 0x60;
          } while (uVar8 + (uVar8 == 0) != uVar13);
        }
        *error = 1;
        pJVar10 = (JsonnetVm *)&files;
        std::__cxx11::stringbuf::str();
        pcVar5 = jsonnet_realloc(pJVar10,(char *)0x0,
                                 files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
        memcpy(pcVar5,(void *)files._M_t._M_impl._0_8_,
               files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
        if ((_Base_ptr *)files._M_t._M_impl._0_8_ !=
            &files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)files._M_t._M_impl._0_8_,
                          (ulong)((long)&(files._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&alloc);
      std::ios_base::~ios_base(local_138);
      __cxa_end_catch();
      return pcVar5;
    }
    if ((_Rb_tree_header *)files._M_t._M_impl.super__Rb_tree_header._M_header._M_left == p_Var14)
    goto LAB_0014837e;
    lVar16 = 0;
    p_Var4 = files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      p_Var2 = p_Var4[1]._M_parent;
      memcpy(pcVar5 + lVar16,*(void **)(p_Var4 + 1),(size_t)((long)&p_Var2->_M_color + 1));
      lVar16 = (long)&p_Var2->_M_color + lVar16 + 1;
      p_Var2 = p_Var4[2]._M_parent;
      memcpy(pcVar5 + lVar16,*(void **)(p_Var4 + 2),(size_t)p_Var2);
      (pcVar5 + (long)&p_Var2->_M_color + lVar16)[0] = '\n';
      (pcVar5 + (long)&p_Var2->_M_color + lVar16)[1] = '\0';
      lVar16 = (long)&p_Var2->_M_color + lVar16 + 2;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var14);
  }
  pcVar5[lVar16] = '\0';
  *error = 0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&files._M_t);
LAB_001483c1:
  std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
  _M_clear(&tokens.
            super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>);
  jsonnet::internal::Allocator::~Allocator(&alloc);
  return pcVar5;
}

Assistant:

static char *jsonnet_evaluate_snippet_aux(JsonnetVm *vm, const char *filename, const char *snippet,
                                          int *error, EvalKind kind)
{
    try {
        Allocator alloc;
        AST *expr;
        Tokens tokens = jsonnet_lex(filename, snippet);

        expr = jsonnet_parse(&alloc, tokens);

        jsonnet_desugar(&alloc, expr, &vm->tla);

        unsigned max_stack = vm->maxStack;

        // For the stdlib desugaring.
        max_stack++;

        // For the TLA desugaring.
        max_stack++;

        jsonnet_static_analysis(expr);
        switch (kind) {
            case REGULAR: {
                std::string json_str = jsonnet_vm_execute(&alloc,
                                                          expr,
                                                          vm->ext,
                                                          max_stack,
                                                          vm->gcMinObjects,
                                                          vm->gcGrowthTrigger,
                                                          vm->nativeCallbacks,
                                                          vm->importCallback,
                                                          vm->importCallbackContext,
                                                          vm->stringOutput);
                json_str += "\n";
                *error = false;
                return from_string(vm, json_str);
            } break;

            case MULTI: {
                std::map<std::string, std::string> files =
                    jsonnet_vm_execute_multi(&alloc,
                                             expr,
                                             vm->ext,
                                             max_stack,
                                             vm->gcMinObjects,
                                             vm->gcGrowthTrigger,
                                             vm->nativeCallbacks,
                                             vm->importCallback,
                                             vm->importCallbackContext,
                                             vm->stringOutput);
                size_t sz = 1;  // final sentinel
                for (const auto &pair : files) {
                    sz += pair.first.length() + 1;   // include sentinel
                    sz += pair.second.length() + 2;  // Add a '\n' as well as sentinel
                }
                char *buf = (char *)::malloc(sz);
                if (buf == nullptr)
                    memory_panic();
                std::ptrdiff_t i = 0;
                for (const auto &pair : files) {
                    memcpy(&buf[i], pair.first.c_str(), pair.first.length() + 1);
                    i += pair.first.length() + 1;
                    memcpy(&buf[i], pair.second.c_str(), pair.second.length());
                    i += pair.second.length();
                    buf[i] = '\n';
                    i++;
                    buf[i] = '\0';
                    i++;
                }
                buf[i] = '\0';  // final sentinel
                *error = false;
                return buf;
            } break;

            case STREAM: {
                std::vector<std::string> documents =
                    jsonnet_vm_execute_stream(&alloc,
                                              expr,
                                              vm->ext,
                                              max_stack,
                                              vm->gcMinObjects,
                                              vm->gcGrowthTrigger,
                                              vm->nativeCallbacks,
                                              vm->importCallback,
                                              vm->importCallbackContext,
                                              vm->stringOutput);
                size_t sz = 1;  // final sentinel
                for (const auto &doc : documents) {
                    sz += doc.length() + 2;  // Add a '\n' as well as sentinel
                }
                char *buf = (char *)::malloc(sz);
                if (buf == nullptr)
                    memory_panic();
                std::ptrdiff_t i = 0;
                for (const auto &doc : documents) {
                    memcpy(&buf[i], doc.c_str(), doc.length());
                    i += doc.length();
                    buf[i] = '\n';
                    i++;
                    buf[i] = '\0';
                    i++;
                }
                buf[i] = '\0';  // final sentinel
                *error = false;
                return buf;
            } break;

            default:
                fputs("INTERNAL ERROR: bad value of 'kind', probably memory corruption.\n", stderr);
                abort();
        }

    } catch (StaticError &e) {
        std::stringstream ss;
        ss << "STATIC ERROR: " << e << std::endl;
        *error = true;
        return from_string(vm, ss.str());

    } catch (RuntimeError &e) {
        std::stringstream ss;
        ss << "RUNTIME ERROR: " << e.msg << std::endl;
        const long max_above = vm->maxTrace / 2;
        const long max_below = vm->maxTrace - max_above;
        const long sz = e.stackTrace.size();
        for (long i = 0; i < sz; ++i) {
            const auto &f = e.stackTrace[i];
            if (vm->maxTrace > 0 && i >= max_above && i < sz - max_below) {
                if (i == max_above)
                    ss << "\t..." << std::endl;
            } else {
                ss << "\t" << f.location << "\t" << f.name << std::endl;
            }
        }
        *error = true;
        return from_string(vm, ss.str());
    }

    return nullptr;  // Quiet, compiler.
}